

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_builtins.cpp
# Opt level: O3

spv_result_t __thiscall
spvtools::val::anon_unknown_0::BuiltInsValidator::ValidatePrimitiveShadingRateAtDefinition
          (BuiltInsValidator *this,Decoration *decoration,Instruction *inst)

{
  bool bVar1;
  spv_result_t sVar2;
  string local_220;
  _Any_data local_200;
  code *local_1f0;
  code *local_1e8;
  spv_result_t local_30;
  
  bVar1 = spvIsVulkanEnv(this->_->context_->target_env);
  if (bVar1) {
    local_200._8_8_ = 0;
    local_200._M_unused._M_object = operator_new(0x18);
    *(BuiltInsValidator **)local_200._M_unused._0_8_ = this;
    *(Instruction **)((long)local_200._M_unused._0_8_ + 8) = inst;
    *(Decoration **)((long)local_200._M_unused._0_8_ + 0x10) = decoration;
    local_1e8 = std::
                _Function_handler<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/val/validate_builtins.cpp:3965:13)>
                ::_M_invoke;
    local_1f0 = std::
                _Function_handler<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/val/validate_builtins.cpp:3965:13)>
                ::_M_manager;
    sVar2 = ValidateI32(this,decoration,inst,
                        (function<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                         *)&local_200);
    if (local_1f0 != (code *)0x0) {
      (*local_1f0)(&local_200,&local_200,__destroy_functor);
    }
    if (sVar2 != SPV_SUCCESS) {
      return sVar2;
    }
    bVar1 = isMeshInterfaceVar(this,inst);
    if (((bVar1) &&
        (bVar1 = EnumSet<spv::Capability>::contains
                           (&this->_->module_capabilities_,CapabilityMeshShadingEXT), bVar1)) &&
       (bVar1 = ValidationState_t::HasDecoration
                          (this->_,(inst->inst_).result_id,DecorationPerPrimitiveEXT), !bVar1)) {
      ValidationState_t::diag((DiagnosticStream *)&local_200,this->_,SPV_ERROR_INVALID_DATA,inst);
      ValidationState_t::VkErrorID_abi_cxx11_(&local_220,this->_,0x1b93,(char *)0x0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_200._M_pod_data,local_220._M_dataplus._M_p,
                 local_220._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_200._M_pod_data,
                 "The variable decorated with PrimitiveShadingRateKHR within the MeshEXT Execution Model must also be decorated with the PerPrimitiveEXT decoration"
                 ,0x91);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_220._M_dataplus._M_p != &local_220.field_2) {
        operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
      }
      DiagnosticStream::~DiagnosticStream((DiagnosticStream *)&local_200);
      return local_30;
    }
  }
  sVar2 = ValidatePrimitiveShadingRateAtReference(this,decoration,inst,inst,inst);
  return sVar2;
}

Assistant:

spv_result_t BuiltInsValidator::ValidatePrimitiveShadingRateAtDefinition(
    const Decoration& decoration, const Instruction& inst) {
  if (spvIsVulkanEnv(_.context()->target_env)) {
    if (spv_result_t error = ValidateI32(
            decoration, inst,
            [this, &inst,
             &decoration](const std::string& message) -> spv_result_t {
              return _.diag(SPV_ERROR_INVALID_DATA, &inst)
                     << _.VkErrorID(4486)
                     << "According to the Vulkan spec BuiltIn "
                     << _.grammar().lookupOperandName(
                            SPV_OPERAND_TYPE_BUILT_IN,
                            (uint32_t)decoration.builtin())
                     << " variable needs to be a 32-bit int scalar. "
                     << message;
            })) {
      return error;
    }
    if (isMeshInterfaceVar(inst) &&
        _.HasCapability(spv::Capability::MeshShadingEXT) &&
        !_.HasDecoration(inst.id(), spv::Decoration::PerPrimitiveEXT)) {
      return _.diag(SPV_ERROR_INVALID_DATA, &inst)
             << _.VkErrorID(7059)
             << "The variable decorated with PrimitiveShadingRateKHR "
                "within the MeshEXT Execution Model must also be "
                "decorated with the PerPrimitiveEXT decoration";
    }
  }

  // Seed at reference checks with this built-in.
  return ValidatePrimitiveShadingRateAtReference(decoration, inst, inst, inst);
}